

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_ExplicitlyMapEntryError_Test::
TestBody(ParserValidationErrorTest_ExplicitlyMapEntryError_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38
  ;
  string_view local_20;
  ParserValidationErrorTest_ExplicitlyMapEntryError_Test *local_10;
  ParserValidationErrorTest_ExplicitlyMapEntryError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "message Foo {\n  message ValueEntry {\n    option map_entry = true;\n    optional int32 key = 1;\n    optional int32 value = 2;\n    extensions 99 to 999;\n  }\n}"
            );
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_38,
            "2:11: map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.\n");
  ParserTest::ExpectHasErrors(&this->super_ParserValidationErrorTest,local_20,&local_38);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_38);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, ExplicitlyMapEntryError) {
  ExpectHasErrors(
      "message Foo {\n"
      "  message ValueEntry {\n"
      "    option map_entry = true;\n"
      "    optional int32 key = 1;\n"
      "    optional int32 value = 2;\n"
      "    extensions 99 to 999;\n"
      "  }\n"
      "}",
      "2:11: map_entry should not be set explicitly. Use "
      "map<KeyType, ValueType> instead.\n");
}